

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void update_component_monitors
               (ecs_world_t *world,ecs_entity_t entity,ecs_entities_t *added,ecs_entities_t *removed
               )

{
  _Bool _Var1;
  _Bool _Var2;
  void *pvVar3;
  ecs_entities_t eVar4;
  undefined1 local_48 [8];
  ecs_entities_t entities;
  ecs_type_t type;
  _Bool childof_changed;
  ecs_entities_t *removed_local;
  ecs_entities_t *added_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  _Var1 = update_component_monitor_w_array(world,&world->component_monitors,added);
  _Var2 = update_component_monitor_w_array(world,&world->component_monitors,removed);
  if (_Var1 || _Var2) {
    pvVar3 = _ecs_map_get(world->child_tables,8,entity);
    if (pvVar3 != (void *)0x0) {
      entities._8_8_ = ecs_get_type(world,entity);
      eVar4 = ecs_type_to_entities((ecs_type_t)entities._8_8_);
      local_48 = (undefined1  [8])eVar4.array;
      entities.array._0_4_ = eVar4.count;
      update_component_monitor_w_array(world,&world->parent_monitors,(ecs_entities_t *)local_48);
    }
  }
  return;
}

Assistant:

static
void update_component_monitors(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entities_t * added,
    ecs_entities_t * removed)
{
    bool childof_changed = update_component_monitor_w_array(
        world, &world->component_monitors, added);

    childof_changed |= update_component_monitor_w_array(
        world, &world->component_monitors, removed);

    /* If this entity is a parent, check if anything changed that could impact
     * its place in the hierarchy. If so, we need to mark all of the parent's
     * entities as dirty. */
    if (childof_changed && 
        ecs_map_get(world->child_tables, ecs_vector_t*, entity)) 
    {
        ecs_type_t type = ecs_get_type(world, entity);
        ecs_entities_t entities = ecs_type_to_entities(type);
        update_component_monitor_w_array(world, 
            &world->parent_monitors, &entities);
    }
}